

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void terminal_deletechars(EditLine *el,wchar_t num)

{
  char *pcVar1;
  char **ppcVar2;
  bool bVar3;
  
  if (((num < L'\x01') || (((el->el_terminal).t_flags & L'\x02') == L'\0')) ||
     ((el->el_terminal).t_size.h < num)) {
    return;
  }
  ppcVar2 = (el->el_terminal).t_str;
  pcVar1 = ppcVar2[0x1e];
  if (((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) ||
     ((num == L'\x01' && ((ppcVar2[6] != (char *)0x0 && (*ppcVar2[6] != '\0')))))) {
    pcVar1 = ppcVar2[8];
    if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
      terminal_tputs(el,pcVar1,L'\x01');
      ppcVar2 = (el->el_terminal).t_str;
    }
    if ((ppcVar2[6] != (char *)0x0) && (*ppcVar2[6] != '\0')) {
      while (bVar3 = num != L'\0', num = num + L'\xffffffff', bVar3) {
        terminal_tputs(el,(el->el_terminal).t_str[6],L'\x01');
      }
      ppcVar2 = (el->el_terminal).t_str;
    }
    pcVar1 = ppcVar2[9];
    if (pcVar1 == (char *)0x0) {
      return;
    }
    if (*pcVar1 == '\0') {
      return;
    }
    num = L'\x01';
  }
  else {
    pcVar1 = (char *)tgoto(pcVar1,num,num);
  }
  terminal_tputs(el,pcVar1,num);
  return;
}

Assistant:

libedit_private void
terminal_deletechars(EditLine *el, int num)
{
	if (num <= 0)
		return;

	if (!EL_CAN_DELETE) {
#ifdef DEBUG_EDIT
		(void) fprintf(el->el_errfile, "   ERROR: cannot delete   \n");
#endif /* DEBUG_EDIT */
		return;
	}
	if (num > el->el_terminal.t_size.h) {
#ifdef DEBUG_SCREEN
		(void) fprintf(el->el_errfile,
		    "%s: num is ridiculous: %d\r\n", __func__, num);
#endif /* DEBUG_SCREEN */
		return;
	}
	if (GoodStr(T_DC))	/* if I have multiple delete */
		if ((num > 1) || !GoodStr(T_dc)) {	/* if dc would be more
							 * expen. */
			terminal_tputs(el, tgoto(Str(T_DC), num, num), num);
			return;
		}
	if (GoodStr(T_dm))	/* if I have delete mode */
		terminal_tputs(el, Str(T_dm), 1);

	if (GoodStr(T_dc))	/* else do one at a time */
		while (num--)
			terminal_tputs(el, Str(T_dc), 1);

	if (GoodStr(T_ed))	/* if I have delete mode */
		terminal_tputs(el, Str(T_ed), 1);
}